

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O2

int xSAT_SolverParseDimacs(FILE *pFile,xSAT_Solver_t **p)

{
  char cVar1;
  ushort *puVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int *piVar6;
  Vec_Int_t *vLits;
  int iVar7;
  uint uVar8;
  long lVar9;
  xSAT_Solver_t *local_58;
  char *local_50;
  char *local_48;
  xSAT_Solver_t **local_40;
  ushort **local_38;
  
  local_40 = p;
  pcVar5 = xSAT_FileRead(pFile);
  local_38 = __ctype_b_loc();
  vLits = (Vec_Int_t *)0x0;
  local_58 = (xSAT_Solver_t *)0x0;
  local_50 = pcVar5;
  local_48 = pcVar5;
  do {
    while( true ) {
      while( true ) {
        puVar2 = *local_38;
        local_50 = local_50 + -1;
        do {
          cVar1 = local_50[1];
          local_50 = local_50 + 1;
        } while ((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 0x20) != 0);
        if (cVar1 != 'c') break;
        skipLine(&local_50);
      }
      pcVar5 = local_50;
      if (cVar1 != 'p') break;
      do {
        local_50 = pcVar5;
        pcVar5 = local_50 + 1;
      } while ((*(byte *)((long)puVar2 + (long)local_50[1] * 2 + 1) & 0x20) != 0);
      do {
        pcVar5 = local_50 + 1;
        local_50 = local_50 + 1;
      } while ((*(byte *)((long)puVar2 + (long)*pcVar5 * 2 + 1) & 0x20) == 0);
      iVar4 = xSAT_ReadInt(&local_50);
      xSAT_ReadInt(&local_50);
      skipLine(&local_50);
      local_58 = xSAT_SolverCreate();
      vLits = (Vec_Int_t *)malloc(0x10);
      if (iVar4 - 1U < 0xf) {
        iVar4 = 0x10;
      }
      vLits->nSize = 0;
      vLits->nCap = iVar4;
      if (iVar4 == 0) {
        piVar6 = (int *)0x0;
      }
      else {
        piVar6 = (int *)malloc((long)iVar4 << 2);
      }
      vLits->pArray = piVar6;
    }
    if (cVar1 == '\0') {
      free(vLits->pArray);
      free(vLits);
      *local_40 = local_58;
      iVar4 = xSAT_SolverSimplify(local_58);
      pcVar5 = local_48;
      goto LAB_00467994;
    }
    if (local_58 == (xSAT_Solver_t *)0x0) {
      puts("There is no parameter line.");
      exit(1);
    }
    vLits->nSize = 0;
    while (iVar4 = xSAT_ReadInt(&local_50), iVar4 != 0) {
      iVar3 = -iVar4;
      if (0 < iVar4) {
        iVar3 = iVar4;
      }
      iVar7 = vLits->nSize;
      if (iVar7 == vLits->nCap) {
        uVar8 = iVar7 * 2;
        if (iVar7 < 0x10) {
          uVar8 = 0x10;
        }
        piVar6 = vLits->pArray;
        if (iVar7 < (int)uVar8) {
          if (piVar6 == (int *)0x0) {
            piVar6 = (int *)malloc((ulong)uVar8 << 2);
          }
          else {
            piVar6 = (int *)realloc(piVar6,(ulong)uVar8 << 2);
          }
          vLits->pArray = piVar6;
          if (piVar6 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vLits->nCap = uVar8;
          iVar7 = vLits->nSize;
        }
      }
      else {
        piVar6 = vLits->pArray;
      }
      vLits->nSize = iVar7 + 1;
      piVar6[iVar7] = (uint)(iVar4 < 1) + iVar3 * 2 + -2;
    }
    iVar4 = xSAT_SolverAddClause(local_58,vLits);
  } while (iVar4 != 0);
  printf("Vector has %d entries: {",(ulong)(uint)vLits->nSize);
  pcVar5 = local_48;
  for (lVar9 = 0; lVar9 < vLits->nSize; lVar9 = lVar9 + 1) {
    printf(" %d",(ulong)(uint)vLits->pArray[lVar9]);
  }
  puts(" }");
  iVar4 = 0;
LAB_00467994:
  free(pcVar5);
  return iVar4;
}

Assistant:

int xSAT_SolverParseDimacs( FILE * pFile, xSAT_Solver_t ** p )
{
    char * pText;
    int  Value;
    pText = xSAT_FileRead( pFile );
    Value = xSAT_ParseDimacs( pText, p );
    ABC_FREE( pText );
    return Value;
}